

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O1

int __thiscall xmrig::TcpServer::bind(TcpServer *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint uVar1;
  int size;
  sockaddr_storage storage;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (this->m_version != 0) {
    uv_tcp_bind(this->m_tcp,&this->m_addr,0);
    uVar1 = uv_listen(this->m_tcp,0x1ff,onConnection);
    if (uVar1 == 0) {
      if (this->m_port == 0) {
        local_28 = 0;
        uStack_20 = 0;
        local_38 = 0;
        uStack_30 = 0;
        local_48 = 0;
        uStack_40 = 0;
        local_58 = 0;
        uStack_50 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        uStack_70 = 0;
        local_88 = 0;
        uStack_80 = 0;
        local_98 = 0;
        uStack_90 = 0;
        uv_tcp_getsockname(this->m_tcp,&local_98);
        this->m_port = local_98._2_2_ << 8 | local_98._2_2_ >> 8;
      }
      uVar1 = (uint)this->m_port;
    }
    return uVar1;
  }
  return -3000;
}

Assistant:

int xmrig::TcpServer::bind()
{
    if (!m_version) {
        return UV_EAI_ADDRFAMILY;
    }

    uv_tcp_bind(m_tcp, reinterpret_cast<const sockaddr*>(&m_addr), 0);

    const int rc = uv_listen(reinterpret_cast<uv_stream_t*>(m_tcp), 511, TcpServer::onConnection);
    if (rc != 0) {
        return rc;
    }

    if (!m_port) {
        sockaddr_storage storage = {};
        int size = sizeof(storage);

        uv_tcp_getsockname(m_tcp, reinterpret_cast<sockaddr*>(&storage), &size);

        m_port = ntohs(reinterpret_cast<sockaddr_in *>(&storage)->sin_port);
    }

    return m_port;
}